

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O2

void fs_cb(uv_fs_t *req)

{
  uint uVar1;
  bool bVar2;
  int64_t eval_b;
  int64_t eval_a;
  
  if (((req->type == UV_FS) && (uVar1 = req->fs_type + UV_FS_UNKNOWN, uVar1 < 0x18)) &&
     ((0xd5c0efU >> (uVar1 & 0x1f) & 1) != 0)) {
    bVar2 = true;
  }
  else {
    bVar2 = req->result == -0x7d;
  }
  if (bVar2) {
    uv_fs_req_cleanup();
    fs_cb_called = fs_cb_called + 1;
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
          ,0x7f,"known_broken((uv_req_t*) req) || req->result == UV_ECANCELED","!=","0",0,"!=",0);
  abort();
}

Assistant:

static void fs_cb(uv_fs_t* req) {
  ASSERT_NE(known_broken((uv_req_t*) req) || \
      req->result == UV_ECANCELED, 0);
  uv_fs_req_cleanup(req);
  fs_cb_called++;
}